

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::api::anon_unknown_1::createMaxConcurrentTest<vkt::api::(anonymous_namespace)::Buffer>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,Context *context,
          Parameters params)

{
  deUint64 dVar1;
  long *plVar2;
  deUint32 dVar3;
  pointer pSVar4;
  pointer device;
  VkDeviceSize objectDeviceMemorySize;
  VkAllocationCallbacks *allocator;
  DeviceInterface *vk;
  VkDevice device_00;
  size_t sVar5;
  size_t sVar6;
  char *__s;
  size_t sVar7;
  deUint64 *pdVar8;
  long *plVar9;
  int *piVar10;
  VkBufferUsageFlags VVar11;
  ulong uVar12;
  size_type __n;
  long lVar13;
  Environment env_2;
  Environment env;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
  objects;
  AllocationCallbackRecorder allocRecorder;
  Move<vk::Handle<(vk::HandleType)8>_> local_2d8;
  undefined8 local_2b8;
  VkAllocationCallbacks *local_2b0;
  undefined4 local_2a8;
  undefined1 local_2a0 [20];
  uint uStack_28c;
  Context *local_288;
  VkBufferUsageFlags local_280;
  VkSharingMode VStack_27c;
  deUint32 dStack_278;
  undefined4 uStack_274;
  VkAllocationCallbacks **local_270;
  VkBuffer local_268;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_260;
  Move<vk::Handle<(vk::HandleType)8>_> local_240;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
  local_220;
  deUint32 local_208 [2];
  undefined8 local_200;
  undefined8 local_1f8;
  undefined4 local_1f0;
  Move<vk::Handle<(vk::HandleType)8>_> local_1e8;
  VkMemoryRequirements local_1c8;
  undefined1 local_1b0 [8];
  VkAllocationCallbacks local_1a8 [2];
  ios_base local_138 [264];
  
  VVar11 = (VkBufferUsageFlags)params.size;
  local_220.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = *(pointer *)(this + 8);
  pSVar4 = (pointer)Context::getDeviceInterface((Context *)this);
  local_220.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pSVar4;
  device = (pointer)Context::getDevice((Context *)this);
  local_220.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = device;
  local_208[0] = Context::getUniversalQueueFamilyIndex((Context *)this);
  local_200 = *(undefined8 *)(this + 0x10);
  local_1f8 = 0;
  local_1f0 = 1;
  local_1b0._0_4_ = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  local_1a8[0].pUserData = (void *)0x0;
  local_1a8[0].pfnAllocation._0_4_ = 0;
  local_1a8[0]._28_8_ = 0x100000000;
  local_1a8[0].pfnReallocation = (PFN_vkReallocationFunction)context;
  local_1a8[0].pfnFree._0_4_ = VVar11;
  local_1a8[0].pfnInternalFree = (PFN_vkInternalFreeNotification)local_208;
  ::vk::createBuffer(&local_240,(DeviceInterface *)pSVar4,(VkDevice)device,
                     (VkBufferCreateInfo *)local_1b0,(VkAllocationCallbacks *)0x0);
  ::vk::getBufferMemoryRequirements
            (&local_1c8,
             (DeviceInterface *)
             local_220.
             super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (VkDevice)
             local_220.
             super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (VkBuffer)
             local_240.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
  objectDeviceMemorySize = getPageTableSize((Context *)**(undefined8 **)this,local_1c8.size);
  allocator = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_1b0,allocator,0x400);
  dVar1 = *(deUint64 *)(this + 8);
  vk = Context::getDeviceInterface((Context *)this);
  device_00 = Context::getDevice((Context *)this);
  dVar3 = Context::getUniversalQueueFamilyIndex((Context *)this);
  local_2b8 = *(undefined8 *)(this + 0x10);
  local_2d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       CONCAT44(local_2d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator.
                _4_4_,dVar3);
  local_2a8 = 1;
  local_2d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = dVar1;
  local_2d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface = vk;
  local_2d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = device_00;
  local_2b0 = local_1a8;
  sVar5 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)local_1b0);
  local_270 = &local_2d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  local_2a0._0_4_ = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  local_2a0._8_8_ = (void *)0x0;
  stack0xfffffffffffffd70 = (VkDevice)((ulong)uStack_28c << 0x20);
  VStack_27c = VK_SHARING_MODE_EXCLUSIVE;
  dStack_278 = 1;
  local_288 = context;
  local_280 = VVar11;
  ::vk::createBuffer(&local_1e8,vk,device_00,(VkBufferCreateInfo *)local_2a0,local_1a8);
  local_268.m_internal =
       local_1e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  DStack_260.m_deviceIface =
       local_1e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  DStack_260.m_device =
       local_1e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  DStack_260.m_allocator =
       local_1e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  sVar6 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)local_1b0);
  if (local_268.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_260,local_268);
  }
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_1b0);
  sVar5 = getSafeObjectCount((Context *)**(undefined8 **)this,sVar6 - sVar5,objectDeviceMemorySize);
  if (local_240.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_240.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               local_240.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
  }
  __n = 0x4000;
  if (sVar5 < 0x4000) {
    __n = sVar5;
  }
  local_2a0._0_8_ = *(undefined8 *)(this + 8);
  local_2a0._8_8_ = Context::getDeviceInterface((Context *)this);
  register0x00000000 = Context::getDevice((Context *)this);
  dVar3 = Context::getUniversalQueueFamilyIndex((Context *)this);
  local_288 = (Context *)CONCAT44(local_288._4_4_,dVar3);
  local_280 = (VkBufferUsageFlags)*(undefined8 *)(this + 0x10);
  VStack_27c = (VkSharingMode)((ulong)*(undefined8 *)(this + 0x10) >> 0x20);
  dStack_278 = 0;
  uStack_274 = 0;
  local_270 = (VkAllocationCallbacks **)CONCAT44(local_270._4_4_,(int)__n);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
  ::vector(&local_220,__n,(allocator_type *)local_1b0);
  local_1b0 = *(undefined1 (*) [8])(*(long *)this + 0x10);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Creating ",9);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
  __s = ::vk::getTypeName<vk::Handle<(vk::HandleType)8>>();
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)((long)local_1a8[0].pUserData + -0x18) + (int)local_1a8);
  }
  else {
    sVar7 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," objects",8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  if (sVar5 != 0) {
    lVar13 = 8;
    uVar12 = 0;
    do {
      pdVar8 = (deUint64 *)operator_new(0x20);
      local_1b0._0_4_ = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
      local_1a8[0].pUserData = (void *)0x0;
      local_1a8[0].pfnAllocation._0_4_ = 0;
      local_1a8[0]._28_8_ = 0x100000000;
      local_1a8[0].pfnInternalFree = (PFN_vkInternalFreeNotification)&local_288;
      local_1a8[0].pfnReallocation = (PFN_vkReallocationFunction)context;
      local_1a8[0].pfnFree._0_4_ = VVar11;
      ::vk::createBuffer(&local_2d8,(DeviceInterface *)local_2a0._8_8_,stack0xfffffffffffffd70,
                         (VkBufferCreateInfo *)local_1b0,
                         (VkAllocationCallbacks *)CONCAT44(uStack_274,dStack_278));
      pdVar8[2] = (deUint64)
                  local_2d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
      pdVar8[3] = (deUint64)
                  local_2d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator
      ;
      *pdVar8 = local_2d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
      pdVar8[1] = (deUint64)
                  local_2d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                  m_deviceIface;
      local_2d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
      local_2d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)0x0;
      local_2d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
           (VkDevice)0x0;
      local_2d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      plVar9 = (long *)operator_new(0x20);
      pSVar4 = local_220.
               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined4 *)(plVar9 + 1) = 0;
      *(undefined4 *)((long)plVar9 + 0xc) = 0;
      *plVar9 = (long)&PTR__SharedPtrState_00d24790;
      plVar9[2] = (long)pdVar8;
      *(undefined4 *)(plVar9 + 1) = 1;
      *(undefined4 *)((long)plVar9 + 0xc) = 1;
      plVar2 = *(long **)((long)&(local_220.
                                  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar13);
      if (plVar2 != plVar9) {
        if (plVar2 != (long *)0x0) {
          LOCK();
          plVar2 = plVar2 + 1;
          *(int *)plVar2 = (int)*plVar2 + -1;
          UNLOCK();
          if ((int)*plVar2 == 0) {
            *(undefined8 *)
             ((long)local_220.
                    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar13 + -8) = 0;
            (**(code **)(**(long **)((long)&(local_220.
                                             super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->m_ptr +
                                    lVar13) + 0x10))();
          }
          LOCK();
          piVar10 = (int *)(*(long *)((long)&pSVar4->m_ptr + lVar13) + 0xc);
          *piVar10 = *piVar10 + -1;
          UNLOCK();
          if (*piVar10 == 0) {
            plVar2 = *(long **)((long)&pSVar4->m_ptr + lVar13);
            if (plVar2 != (long *)0x0) {
              (**(code **)(*plVar2 + 8))();
            }
            *(undefined8 *)((long)&pSVar4->m_ptr + lVar13) = 0;
          }
        }
        *(deUint64 **)((long)pSVar4 + lVar13 + -8) = pdVar8;
        *(long **)((long)&pSVar4->m_ptr + lVar13) = plVar9;
        LOCK();
        *(int *)(plVar9 + 1) = (int)plVar9[1] + 1;
        UNLOCK();
        LOCK();
        piVar10 = (int *)(*(long *)((long)&pSVar4->m_ptr + lVar13) + 0xc);
        *piVar10 = *piVar10 + 1;
        UNLOCK();
      }
      plVar2 = plVar9 + 1;
      LOCK();
      *(int *)plVar2 = (int)*plVar2 + -1;
      UNLOCK();
      if ((int)*plVar2 == 0) {
        (**(code **)(*plVar9 + 0x10))(plVar9);
      }
      piVar10 = (int *)((long)plVar9 + 0xc);
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        (**(code **)(*plVar9 + 8))(plVar9);
      }
      if (local_2d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                  (&local_2d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
                   (VkBuffer)
                   local_2d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal)
        ;
      }
      if ((uVar12 & 0x3ff) == 0 && uVar12 != 0) {
        tcu::TestContext::touchWatchdog(*(TestContext **)this);
      }
      uVar12 = uVar12 + 1;
      lVar13 = lVar13 + 0x10;
    } while (__n != uVar12);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
  ::_M_erase_at_end(&local_220,
                    local_220.
                    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  local_1b0 = (undefined1  [8])&local_1a8[0].pfnAllocation;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"Ok","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_1b0,
             (undefined1 *)((long)local_1a8[0].pUserData + (long)local_1b0));
  if (local_1b0 != (undefined1  [8])&local_1a8[0].pfnAllocation) {
    operator_delete((void *)local_1b0,
                    CONCAT44(local_1a8[0].pfnAllocation._4_4_,
                             (VkBufferCreateFlags)local_1a8[0].pfnAllocation) + 1);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
  ::~vector(&local_220);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMaxConcurrentTest (Context& context, typename Object::Parameters params)
{
	typedef Unique<typename Object::Type>	UniqueObject;
	typedef SharedPtr<UniqueObject>			ObjectPtr;

	const deUint32						numObjects			= Object::getMaxConcurrent(context, params);
	const Environment					env					(context, numObjects);
	const typename Object::Resources	res					(env, params);
	vector<ObjectPtr>					objects				(numObjects);
	const deUint32						watchdogInterval	= 1024;

	context.getTestContext().getLog()
		<< TestLog::Message << "Creating " << numObjects << " " << getTypeName<typename Object::Type>() << " objects" << TestLog::EndMessage;

	for (deUint32 ndx = 0; ndx < numObjects; ndx++)
	{
		objects[ndx] = ObjectPtr(new UniqueObject(Object::create(env, res, params)));

		if ((ndx > 0) && ((ndx % watchdogInterval) == 0))
			context.getTestContext().touchWatchdog();
	}

	objects.clear();

	return tcu::TestStatus::pass("Ok");
}